

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O1

void dump_conspage(conspage *base,int linking)

{
  uint uVar1;
  ulong uVar2;
  LispPTR *pLVar3;
  LispPTR *pLVar4;
  
  while( true ) {
    if (((ulong)base & 1) != 0) {
      printf("Misaligned pointer in LAddrFromNative %p\n",base);
    }
    printf("conspage at 0x%x(lisp) has %d free cells , next available cell offset is %d ,and next page is 0x%x(lisp)\n"
           ,(ulong)((long)base - (long)Lisp_world) >> 1,(ulong)(*(uint *)&base->field_0x8 >> 0x18),
           (ulong)(*(uint *)&base->field_0x8 >> 0x10 & 0xff),(ulong)base->next_page);
    pLVar3 = &base->cell4;
    uVar2 = 1;
    pLVar4 = pLVar3;
    do {
      if (((ulong)base & 1) != 0) {
        printf("Misaligned pointer in LAddrFromNative %p\n",pLVar4);
      }
      printf(" LADDR : %d = Cell[ %d ]## cdr_code= %d ,car = %d\n",
             (ulong)((long)pLVar3 - (long)Lisp_world) >> 1,uVar2,(ulong)(*pLVar4 >> 0x1c),
             (ulong)(*pLVar4 & 0xfffffff));
      uVar1 = (int)uVar2 + 1;
      uVar2 = (ulong)uVar1;
      pLVar4 = pLVar4 + 1;
      pLVar3 = pLVar3 + 1;
    } while (uVar1 != 0x80);
    if ((linking != 1) || (base->next_page == 0)) break;
    base = (conspage *)(Lisp_world + (base->next_page << 8));
  }
  return;
}

Assistant:

void dump_conspage(struct conspage *base, int linking)
/* target conspage address */
/* look for chaining conspage ? T/NIL */
{
  ConsCell *cell;
  int i;

lp:
  printf(
      "conspage at 0x%x(lisp) has %d free cells , next available cell offset is %d ,and next page "
      "is 0x%x(lisp)\n",
      LAddrFromNative(base), (0xff & base->count), (0xff & base->next_cell), base->next_page);

  for (i = 0, cell = (ConsCell *)base + 1; i < 127; i++, cell++) {
    printf(" LADDR : %d = Cell[ %d ]## cdr_code= %d ,car = %d\n", LAddrFromNative(cell), i + 1,
           cell->cdr_code, cell->car_field);
  }

  if ((linking == T) && (base->next_page != NIL_PTR)) {
    base = (struct conspage *)NativeAligned4FromLPage(base->next_page);
    goto lp;
  }

}